

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrgif.c
# Opt level: O1

void finish_output_gif(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo)

{
  undefined1 uVar1;
  jpeg_error_mgr *pjVar2;
  int iVar3;
  
  if (*(int *)&dinfo[1].output_file == 0) {
    output((gif_dest_ptr)dinfo,*(code_int *)((long)&dinfo[1].calc_buffer_dimensions + 4));
  }
  output((gif_dest_ptr)dinfo,*(code_int *)((long)&dinfo[1].output_file + 6));
  if (0 < *(int *)&dinfo[1].calc_buffer_dimensions) {
    uVar1 = *(undefined1 *)((long)&dinfo[1].finish_output + 4);
    iVar3 = *(int *)&dinfo[2].put_pixel_rows;
    *(int *)&dinfo[2].put_pixel_rows = iVar3 + 1;
    *(undefined1 *)((long)&dinfo[2].put_pixel_rows + (long)iVar3 + 5) = uVar1;
    if (0xfe < *(int *)&dinfo[2].put_pixel_rows) {
      flush_packet((gif_dest_ptr)dinfo);
    }
  }
  flush_packet((gif_dest_ptr)dinfo);
  putc(0,(FILE *)dinfo->output_file);
  putc(0x3b,(FILE *)dinfo->output_file);
  fflush((FILE *)dinfo->output_file);
  iVar3 = ferror((FILE *)dinfo->output_file);
  if (iVar3 != 0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x25;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
    return;
  }
  return;
}

Assistant:

METHODDEF(void)
finish_output_gif(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo)
{
  gif_dest_ptr dest = (gif_dest_ptr)dinfo;

  /* Flush compression mechanism */
  compress_term(dest);
  /* Write a zero-length data block to end the series */
  putc(0, dest->pub.output_file);
  /* Write the GIF terminator mark */
  putc(';', dest->pub.output_file);
  /* Make sure we wrote the output file OK */
  fflush(dest->pub.output_file);
  if (ferror(dest->pub.output_file))
    ERREXIT(cinfo, JERR_FILE_WRITE);
}